

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cast.hpp
# Opt level: O0

unsigned_short Diligent::StaticCast<unsigned_short,unsigned_int>(uint *Src)

{
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  uint *Src_local;
  
  msg.field_2._8_8_ = Src;
  if (*Src != (*Src & 0xffff)) {
    FormatString<char[20]>((string *)local_30,(char (*) [20])"Cast will lose data");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"StaticCast",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/../../Common/interface/Cast.hpp"
               ,0x40);
    std::__cxx11::string::~string((string *)local_30);
  }
  return (unsigned_short)*(undefined4 *)msg.field_2._8_8_;
}

Assistant:

NODISCARD DstType StaticCast(const SrcType& Src)
{
#ifdef DILIGENT_DEBUG
    using MaxType = decltype(DstType{1} + SrcType{1});
    VERIFY(static_cast<MaxType>(Src) == static_cast<MaxType>(static_cast<DstType>(Src)), "Cast will lose data");
#endif
    return static_cast<DstType>(Src);
}